

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O3

void gray_render_cubic(PWorker worker,PVG_FT_Vector *control1,PVG_FT_Vector *control2,
                      PVG_FT_Vector *to)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long in_R8;
  ulong uVar6;
  long lVar7;
  long in_R9;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  PVG_FT_Vector bez_stack [49];
  long alStack_378 [5];
  undefined8 uStack_350;
  long local_348;
  long local_340 [5];
  TPos local_318;
  long local_310 [92];
  
  lVar8 = in_R9 << 2;
  local_348 = lVar8;
  lVar5 = bez_stack[0].y * 4;
  local_340[0] = lVar5;
  local_340[1] = (long)to << 2;
  local_340[2] = in_R8 * 4;
  local_340[3] = (long)control1 << 2;
  local_340[4] = (long)control2 * 4;
  local_318 = worker->x;
  lVar1 = worker->y;
  local_310[0] = lVar1;
  lVar14 = worker->max_ey;
  if (((lVar14 <= in_R8 >> 6 && lVar14 <= bez_stack[0].y >> 6) &&
      (lVar14 <= lVar1 >> 8 && lVar14 <= (long)control2 >> 6)) ||
     (lVar14 = worker->min_ey,
     (((long)control2 >> 6 < lVar14 && in_R8 >> 6 < lVar14) && bez_stack[0].y >> 6 < lVar14) &&
     lVar1 >> 8 < lVar14)) {
    worker->x = lVar8;
    worker->y = lVar5;
    return;
  }
  lVar14 = 0;
  do {
    lVar4 = *(long *)((long)&local_318 + lVar14);
    uVar3 = lVar4 - lVar8;
    uVar2 = lVar1 - lVar5;
    uVar9 = -uVar3;
    if (0 < (long)uVar3) {
      uVar9 = uVar3;
    }
    uVar6 = -uVar2;
    if (0 < (long)uVar2) {
      uVar6 = uVar2;
    }
    if (uVar6 < uVar9) {
      uVar6 = uVar6 * 3 >> 3;
    }
    else {
      uVar9 = uVar9 * 3 >> 3;
    }
    if (uVar6 + uVar9 < 0x800000) {
      uVar15 = (uVar6 + uVar9) * 0x2a;
      lVar10 = *(long *)((long)local_340 + lVar14 + 8) - lVar8;
      lVar7 = *(long *)((long)local_340 + lVar14 + 0x10) - lVar5;
      uVar6 = lVar10 * uVar2 - lVar7 * uVar3;
      uVar9 = -uVar6;
      if (0 < (long)uVar6) {
        uVar9 = uVar6;
      }
      if (uVar15 < uVar9) goto LAB_00122186;
      lVar13 = *(long *)((long)local_340 + lVar14 + 0x18) - lVar8;
      lVar12 = *(long *)((long)local_340 + lVar14 + 0x20) - lVar5;
      uVar6 = lVar13 * uVar2 - lVar12 * uVar3;
      uVar9 = -uVar6;
      if (0 < (long)uVar6) {
        uVar9 = uVar6;
      }
      if (((uVar15 < uVar9) ||
          (lVar10 = (lVar10 - uVar3) * lVar10, lVar7 = (lVar7 - uVar2) * lVar7,
          lVar11 = lVar7 + lVar10, lVar11 != 0 && SCARRY8(lVar7,lVar10) == lVar11 < 0)) ||
         (lVar13 = (lVar13 - uVar3) * lVar13, lVar12 = (lVar12 - uVar2) * lVar12,
         lVar7 = lVar12 + lVar13, lVar7 != 0 && SCARRY8(lVar12,lVar13) == lVar7 < 0))
      goto LAB_00122186;
      uStack_350 = 0x1222c1;
      gray_render_line(worker,lVar8,lVar5);
      if (lVar14 == 0) {
        return;
      }
      lVar8 = *(long *)((long)alStack_378 + lVar14);
      lVar14 = lVar14 + -0x30;
    }
    else {
LAB_00122186:
      if (lVar14 == 0x2d0) {
        return;
      }
      *(long *)((long)local_310 + lVar14 + 0x28) = lVar4;
      lVar7 = *(long *)((long)local_340 + lVar14 + 0x18);
      lVar10 = *(long *)((long)local_340 + lVar14 + 8);
      lVar12 = *(long *)((long)local_340 + lVar14 + 0x10);
      lVar11 = (lVar8 + lVar10) / 2;
      *(long *)((long)local_340 + lVar14 + 8) = lVar11;
      lVar13 = (lVar4 + lVar7) / 2;
      *(long *)((long)local_310 + lVar14 + 0x18) = lVar13;
      lVar8 = (lVar7 + lVar10) / 2;
      lVar4 = (lVar11 + lVar8) / 2;
      *(long *)((long)local_340 + lVar14 + 0x18) = lVar4;
      lVar8 = (lVar8 + lVar13) / 2;
      *(long *)((long)local_310 + lVar14 + 8) = lVar8;
      lVar8 = (lVar8 + lVar4) / 2;
      *(long *)((long)&local_318 + lVar14) = lVar8;
      *(long *)((long)local_310 + lVar14 + 0x30) = lVar1;
      lVar4 = *(long *)((long)local_340 + lVar14 + 0x20);
      lVar5 = (lVar5 + lVar12) / 2;
      *(long *)((long)local_340 + lVar14 + 0x10) = lVar5;
      lVar7 = (lVar1 + lVar4) / 2;
      *(long *)((long)local_310 + lVar14 + 0x20) = lVar7;
      lVar1 = (lVar4 + lVar12) / 2;
      lVar5 = (lVar5 + lVar1) / 2;
      *(long *)((long)local_340 + lVar14 + 0x20) = lVar5;
      lVar1 = (lVar1 + lVar7) / 2;
      *(long *)((long)local_310 + lVar14 + 0x10) = lVar1;
      *(long *)((long)local_310 + lVar14) = (lVar1 + lVar5) / 2;
      lVar14 = lVar14 + 0x30;
    }
    lVar5 = *(TPos *)((long)local_340 + lVar14);
    lVar1 = *(long *)((long)local_310 + lVar14);
  } while( true );
}

Assistant:

static void
  gray_render_cubic( RAS_ARG_ const PVG_FT_Vector*  control1,
                              const PVG_FT_Vector*  control2,
                              const PVG_FT_Vector*  to )
  {
    PVG_FT_Vector   bez_stack[16 * 3 + 1];  /* enough to accommodate bisections */
    PVG_FT_Vector*  arc = bez_stack;
    PVG_FT_Vector*  limit = bez_stack + 45;
    TPos        dx, dy, dx_, dy_;
    TPos        dx1, dy1, dx2, dy2;
    TPos        L, s, s_limit;


    arc[0].x = UPSCALE( to->x );
    arc[0].y = UPSCALE( to->y );
    arc[1].x = UPSCALE( control2->x );
    arc[1].y = UPSCALE( control2->y );
    arc[2].x = UPSCALE( control1->x );
    arc[2].y = UPSCALE( control1->y );
    arc[3].x = ras.x;
    arc[3].y = ras.y;

    /* short-cut the arc that crosses the current band */
    if ( ( TRUNC( arc[0].y ) >= ras.max_ey &&
           TRUNC( arc[1].y ) >= ras.max_ey &&
           TRUNC( arc[2].y ) >= ras.max_ey &&
           TRUNC( arc[3].y ) >= ras.max_ey ) ||
         ( TRUNC( arc[0].y ) <  ras.min_ey &&
           TRUNC( arc[1].y ) <  ras.min_ey &&
           TRUNC( arc[2].y ) <  ras.min_ey &&
           TRUNC( arc[3].y ) <  ras.min_ey ) )
    {
      ras.x = arc[0].x;
      ras.y = arc[0].y;
      return;
    }

    for (;;)
    {
      /* Decide whether to split or draw. See `Rapid Termination          */
      /* Evaluation for Recursive Subdivision of Bezier Curves' by Thomas */
      /* F. Hain, at                                                      */
      /* http://www.cis.southalabama.edu/~hain/general/Publications/Bezier/Camera-ready%20CISST02%202.pdf */


      /* dx and dy are x and y components of the P0-P3 chord vector. */
      dx = dx_ = arc[3].x - arc[0].x;
      dy = dy_ = arc[3].y - arc[0].y;

      L = PVG_FT_HYPOT( dx_, dy_ );

      /* Avoid possible arithmetic overflow below by splitting. */
      if ( L >= (1 << 23) )
        goto Split;

      /* Max deviation may be as much as (s/L) * 3/4 (if Hain's v = 1). */
      s_limit = L * (TPos)( ONE_PIXEL / 6 );

      /* s is L * the perpendicular distance from P1 to the line P0-P3. */
      dx1 = arc[1].x - arc[0].x;
      dy1 = arc[1].y - arc[0].y;
      s = PVG_FT_ABS( dy * dx1 - dx * dy1 );

      if ( s > s_limit )
        goto Split;

      /* s is L * the perpendicular distance from P2 to the line P0-P3. */
      dx2 = arc[2].x - arc[0].x;
      dy2 = arc[2].y - arc[0].y;
      s = PVG_FT_ABS( dy * dx2 - dx * dy2 );

      if ( s > s_limit )
        goto Split;

      /* Split super curvy segments where the off points are so far
         from the chord that the angles P0-P1-P3 or P0-P2-P3 become
         acute as detected by appropriate dot products. */
      if ( dx1 * ( dx1 - dx ) + dy1 * ( dy1 - dy ) > 0 ||
           dx2 * ( dx2 - dx ) + dy2 * ( dy2 - dy ) > 0 )
        goto Split;

      gray_render_line( RAS_VAR_ arc[0].x, arc[0].y );

      if ( arc == bez_stack )
        return;

      arc -= 3;
      continue;

    Split:
      if( arc == limit )
        return;
      gray_split_cubic( arc );
      arc += 3;
    }
  }